

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

float Gia_ManDelayTraceLutPrint(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  void *__s;
  char *pcVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  uint local_64;
  int local_54;
  float Num;
  float nSteps;
  float tDelta;
  float tArrival;
  int *pCounters;
  int Nodes;
  int i;
  If_LibLut_t *pLutLib;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  pvVar2 = p->pLutLib;
  if ((pvVar2 == (void *)0x0) ||
     (iVar5 = *(int *)((long)pvVar2 + 8), iVar3 = Gia_ManLutSizeMax(p), iVar3 <= iVar5)) {
    if (pvVar2 == (void *)0x0) {
      local_54 = Gia_ManLutLevel(p,(int **)0x0);
    }
    else {
      local_54 = 0x14;
    }
    fVar8 = (float)local_54;
    uVar7 = (ulong)(fVar8 + 1.0);
    __s = malloc((uVar7 | (long)((fVar8 + 1.0) - 9.223372e+18) & (long)uVar7 >> 0x3f) << 2);
    fVar9 = (fVar8 + 1.0) * 4.0;
    uVar7 = (ulong)fVar9;
    memset(__s,0,uVar7 | (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f);
    p_local._4_4_ = Gia_ManDelayTraceLut(p);
    for (pCounters._4_4_ = 1; iVar5 = Gia_ManObjNum(p), pCounters._4_4_ < iVar5;
        pCounters._4_4_ = pCounters._4_4_ + 1) {
      iVar5 = Gia_ObjIsLut(p,pCounters._4_4_);
      if ((iVar5 != 0) && (iVar5 = Gia_ObjLutSize(p,pCounters._4_4_), iVar5 != 0)) {
        fVar9 = Gia_ObjTimeSlack(p,pCounters._4_4_);
        fVar9 = fVar9 / (p_local._4_4_ / fVar8);
        if (fVar9 <= fVar8) {
          if ((fVar9 < 0.0) || (fVar8 < fVar9)) {
            __assert_fail("Num >=0 && Num <= nSteps",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                          ,0x1d7,"float Gia_ManDelayTraceLutPrint(Gia_Man_t *, int)");
          }
          *(int *)((long)__s + (long)(int)fVar9 * 4) =
               *(int *)((long)__s + (long)(int)fVar9 * 4) + 1;
        }
      }
    }
    if (fVerbose != 0) {
      pcVar6 = "unit-delay";
      if (pvVar2 != (void *)0x0) {
        pcVar6 = "LUT library";
      }
      printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)p_local._4_4_,pcVar6);
      pCounters._0_4_ = 0;
      for (pCounters._4_4_ = 0; (float)pCounters._4_4_ < fVar8;
          pCounters._4_4_ = pCounters._4_4_ + 1) {
        pCounters._0_4_ = *(int *)((long)__s + (long)pCounters._4_4_ * 4) + (uint)pCounters;
        if (pvVar2 == (void *)0x0) {
          local_64 = pCounters._4_4_ + 1;
        }
        else {
          local_64 = (pCounters._4_4_ + 1) * 5;
        }
        pcVar6 = "lev";
        if (pvVar2 != (void *)0x0) {
          pcVar6 = "%";
        }
        iVar5 = Gia_ManLutNum(p);
        printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)(uint)pCounters * 100.0) / (double)iVar5,
               (ulong)local_64,pcVar6,(ulong)(uint)pCounters);
      }
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    Gia_ManTimeStop(p);
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 8);
    uVar4 = Gia_ManLutSizeMax(p);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar1,
           (ulong)uVar4);
    p_local._4_4_ = -1e+09;
  }
  return p_local._4_4_;
}

Assistant:

float Gia_ManDelayTraceLutPrint( Gia_Man_t * p, int fVerbose )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -ABC_INFINITY;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Gia_ManLutLevel(p, NULL);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta   = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p, i) == 0 )
            continue;
        Num = Gia_ObjTimeSlack(p, i) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results    
    if ( fVerbose )
    {
        printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
        Nodes = 0;
        for ( i = 0; i < nSteps; i++ )
        {
            Nodes += pCounters[i];
            printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
                pLutLib? "%":"lev", Nodes, 100.0*Nodes/Gia_ManLutNum(p) );
        }
    }
    ABC_FREE( pCounters );
    Gia_ManTimeStop( p );
    return tArrival;
}